

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genData.hpp
# Opt level: O3

pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *
genPlanePair<double>
          (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
           *__return_storage_ptr__,Matrix<double,_4,_4,_0,_4,_4> *T)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int *piVar4;
  int iVar5;
  PointerType ptr;
  long lVar6;
  Index outer;
  Index inner;
  long lVar7;
  EigenBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *pEVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Matrix<double,_4,_1,_0,_4,_1> Pi;
  FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> lu;
  Matrix<double,_3,_4,_0,_3,_4> nullMatrix;
  scalar_sum_op<double,_double> local_1e9;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  DecompositionType local_1c8;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
  local_140;
  Matrix<double,_4,_4,_1,_4,_4> local_128;
  DecompositionType *local_a8;
  Matrix<double,_4,_4,_1,_4,_4> *local_a0;
  DecompositionType *local_98;
  undefined8 local_90;
  EigenBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> local_88 [8];
  undefined8 auStack_80 [11];
  
  local_1c8.m_isInitialized = false;
  local_1c8.m_usePrescribedThreshold = false;
  local_1c8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_1c8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  local_1c8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_1c8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)0x0;
  local_1c8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_1c8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_data = (int *)0x0;
  local_1c8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
  m_rows = 0;
  local_1c8.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (int *)0x0;
  local_1c8.m_rowsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_1c8.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.
  m_storage.m_data = (int *)0x0;
  local_1c8.m_colsTranspositions.super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.
  m_storage.m_cols = 0;
  lVar6 = 0;
  do {
    auStack_80[lVar6 + -1] = 0x3ff0000000000000;
    auStack_80[lVar6] = 0x3ff0000000000000;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 0xc);
  pEVar8 = local_88;
  lVar6 = 0;
  do {
    lVar7 = 0;
    do {
      iVar5 = rand();
      *(double *)(pEVar8 + lVar7 * 8) =
           (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0) * 40.0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar6 = lVar6 + 1;
    pEVar8 = pEVar8 + 0x18;
  } while (lVar6 != 3);
  Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::compute<Eigen::Matrix<double,3,4,0,3,4>>
            ((FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,local_88);
  if (local_1c8.m_isInitialized != false) {
    Eigen::internal::
    kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::
    kernel_retval_base((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        *)&local_128,&local_1c8);
    if (((((MatrixType *)
          local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
          array[0])->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
         m_cols == 4) &&
       (local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.
        array[2] == 4.94065645841247e-324)) {
      Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::
      evalTo<Eigen::Matrix<double,4,1,0,4,1>>
                ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)&local_128,
                 (Matrix<double,_4,_1,_0,_4,_1> *)local_1e8);
      local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [1] = 1.48219693752374e-323;
      local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [4] = 0.0;
      local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [6] = 1.97626258336499e-323;
      local_140.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.
      super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
      super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
      .m_data = (PointerType)local_1e8;
      local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [0] = (double)local_1e8;
      local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data.array
      [3] = (double)local_1e8;
      auVar9._0_8_ = Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,-1,1,false>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,_1,1,false>const>>
                               (&local_140,&local_1e9,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                                 *)&local_128);
      auVar9._8_8_ = 0;
      auVar9 = sqrtpd(auVar9,auVar9);
      auVar10._0_8_ = auVar9._0_8_;
      auVar10._8_8_ = auVar10._0_8_;
      local_1e8 = divpd(local_1e8,auVar10);
      local_1d8 = divpd(local_1d8,auVar10);
      local_140.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
      .m_d._0_8_ = T;
      local_140.
      super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
      .
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
      .m_d.argImpl.
      super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
      super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
      .m_data = (PointerType)local_1e8;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_4,_4,_1,_4,_4>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_128,(SrcXprType *)&local_140,(assign_op<double,_double> *)&local_1e9);
      local_a8 = (DecompositionType *)
                 local_140.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                 .m_data;
      local_98 = (DecompositionType *)
                 local_140.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                 .m_data;
      local_90 = 4;
      local_a0 = &local_128;
      if (((ulong)local_140.
                  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                  .
                  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                  .m_d.argImpl.
                  super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                  .super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                  .m_data & 0xf) == 0) {
        dVar1 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_140.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                 .m_data)->m_storage).m_data.array[0];
        dVar2 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_140.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                 .m_data)->m_storage).m_data.array[1];
        dVar3 = (((PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                 local_140.
                 super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                 .
                 super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                 .m_d.argImpl.
                 super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>.
                 super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>.
                 super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                 .m_data)->m_storage).m_data.array[2];
        piVar4 = (((PermutationPType *)
                  ((long)local_140.
                         super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>_>
                         .
                         super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_double>
                         .m_d.argImpl.
                         super_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>_>
                         .
                         super_block_evaluator<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true>
                         .
                         super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,_4,_1>_>
                         .m_data + 0x18))->m_indices).
                 super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[2] = (double)local_1d8._0_8_;
        (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[3] = (double)local_1d8._8_8_;
        (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[0] = (double)local_1e8._0_8_;
        (__return_storage_ptr__->first).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
        .m_storage.m_data.array[1] = (double)local_1e8._8_8_;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[3] * (double)piVar4 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[1] * dVar2 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[2] * dVar3 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[0] * dVar1;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[7] * (double)piVar4 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[5] * dVar2 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[6] * dVar3 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[4] * dVar1;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[0xb] * (double)piVar4 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[9] * dVar2 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[10] * dVar3 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[8] * dVar1;
        (__return_storage_ptr__->second).
        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
             (double)piVar4 *
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.m_storage.m_data
             .array[0xf] +
             dVar2 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xd] +
             dVar3 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xe] +
             dVar1 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>.
                     m_storage.m_data.array[0xc];
        free(local_1c8.m_colsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<int,_1,__1,_1,_1,__1>_>.m_storage.m_data);
        free(local_1c8.m_rowsTranspositions.
             super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        free(local_1c8.m_q.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_1c8.m_p.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
             m_storage.m_data);
        free(local_1c8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data);
        return __return_storage_ptr__;
      }
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 1>, 4, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 1>]"
                 );
  }
  __assert_fail("m_isInitialized && \"LU is not initialized.\"",
                "/usr/include/eigen3/Eigen/src/LU/FullPivLU.h",0xc0,
                "const internal::kernel_retval<FullPivLU<MatrixType>> Eigen::FullPivLU<Eigen::Matrix<double, -1, -1>>::kernel() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>> 
    genPlanePair(Eigen::Matrix<floatPrec,4,4> T){
    
    Eigen::Matrix<floatPrec, 3, 4> nullMatrix;
    Eigen::FullPivLU<Eigen::Matrix<floatPrec, Eigen::Dynamic, Eigen::Dynamic>> lu;

    // the null space of the matrix built from threee
    // randomly generated 3D points in homogenous coordinates
    nullMatrix = Eigen::Matrix<floatPrec, 3, 4>::Ones(3, 4);
    
    nullMatrix.topLeftCorner(3, 3) =
        Eigen::Matrix<floatPrec, 3, 3>::Random(3, 3) * int(POINTSWITHINCUBE);

    lu.compute(nullMatrix);
    Eigen::Matrix<floatPrec, 4,1> Pi = lu.kernel();
    Pi /= Pi.head(3).norm();

    // requires the pose from the two scans, to compute
    // the coordinates of the plane in RefB
    Eigen::Matrix<floatPrec, 4,1> Nu = T.transpose().inverse() * Pi;

    return std::make_pair(Pi,Nu);
}